

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkTestTools.cpp
# Opt level: O3

void __thiscall test::FunctionTimer::EndCall(FunctionTimer *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint64_t uVar3;
  
  if (this->t0 != 0) {
    uVar3 = tonk_time();
    auVar2 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar1 = vpinsrq_avx(auVar2,uVar3 - this->t0,1);
    auVar2._0_8_ = this->Invokations;
    auVar2._8_8_ = this->TotalUsec;
    auVar2 = vpaddq_avx(auVar1,auVar2);
    this->Invokations = auVar2._0_8_;
    this->TotalUsec = auVar2._8_8_;
    this->t0 = 0;
    pthread_mutex_unlock((pthread_mutex_t *)this);
    return;
  }
  __assert_fail("t0 != 0",
                "/workspace/llm4binary/github/license_c_cmakelists/catid[P]tonk/tests/TonkTestTools.cpp"
                ,0x48,"void test::FunctionTimer::EndCall()");
}

Assistant:

void FunctionTimer::EndCall()
{
    assert(t0 != 0);
    uint64_t t1 = tonk_time();
    ++Invokations;
    TotalUsec += t1 - t0;
    t0 = 0;
    CallLock.unlock();
}